

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,false,true>
               (string_t *ldata,timestamp_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  int64_t iVar3;
  ulong uVar4;
  timestamp_t tVar5;
  timestamp_t tVar6;
  ulong uVar7;
  ulong uVar8;
  char **ppcVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  string_t specifier;
  string_t specifier_00;
  string_t specifier_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar3 = rdata->value;
      ppcVar9 = &(ldata->value).pointer.ptr;
      iVar10 = 0;
      tVar6.value = count;
      do {
        specifier_01.value.pointer.ptr = (char *)iVar3;
        specifier_01.value._0_8_ = *ppcVar9;
        tVar5 = DateTruncBinaryOperator::
                Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t>
                          (*(DateTruncBinaryOperator **)(ppcVar9 + -1),specifier_01,tVar6);
        result_data[iVar10].value = tVar5.value;
        iVar10 = iVar10 + 1;
        ppcVar9 = ppcVar9 + 2;
      } while (count != iVar10);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar8 = 0;
    uVar7 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar11 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar11 = count;
        }
LAB_0062980a:
        uVar4 = uVar8;
        if (uVar8 < uVar11) {
          iVar3 = rdata->value;
          ppcVar9 = &ldata[uVar8].value.pointer.ptr;
          tVar6.value = uVar7;
          do {
            specifier.value.pointer.ptr = (char *)iVar3;
            specifier.value._0_8_ = *ppcVar9;
            tVar5 = DateTruncBinaryOperator::
                    Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t>
                              (*(DateTruncBinaryOperator **)(ppcVar9 + -1),specifier,tVar6);
            result_data[uVar8].value = tVar5.value;
            uVar8 = uVar8 + 1;
            ppcVar9 = ppcVar9 + 2;
            uVar4 = uVar11;
          } while (uVar11 != uVar8);
        }
      }
      else {
        uVar2 = puVar1[uVar7];
        uVar11 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar11 = count;
        }
        uVar4 = uVar11;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_0062980a;
          uVar4 = uVar8;
          if (uVar8 < uVar11) {
            ppcVar9 = &ldata[uVar8].value.pointer.ptr;
            uVar12 = 0;
            tVar6.value = uVar7;
            do {
              if ((uVar2 >> (uVar12 & 0x3f) & 1) != 0) {
                specifier_00.value.pointer.ptr = (char *)rdata->value;
                specifier_00.value._0_8_ = *ppcVar9;
                tVar6 = DateTruncBinaryOperator::
                        Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t>
                                  (*(DateTruncBinaryOperator **)(ppcVar9 + -1),specifier_00,tVar6);
                (result_data + uVar8)[uVar12].value = tVar6.value;
                tVar6.value = (int64_t)(result_data + uVar8);
              }
              uVar12 = uVar12 + 1;
              ppcVar9 = ppcVar9 + 2;
              uVar4 = uVar11;
            } while (uVar11 - uVar8 != uVar12);
          }
        }
      }
      uVar8 = uVar4;
      uVar7 = uVar7 + 1;
    } while (uVar7 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}